

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitRethrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Rethrow *curr)

{
  bool bVar1;
  size_t sVar2;
  pair<wasm::WasmException,_wasm::Name> *ppVar3;
  int local_24;
  int i;
  Rethrow *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  sVar2 = SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL>::size(&this->exceptionStack);
  local_24 = (int)sVar2;
  while (local_24 = local_24 + -1, -1 < local_24) {
    ppVar3 = SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL>::operator[]
                       (&this->exceptionStack,(long)local_24);
    bVar1 = IString::operator==(&(ppVar3->second).super_IString,(IString *)(curr + 0x10));
    if (bVar1) {
      ppVar3 = SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL>::operator[]
                         (&this->exceptionStack,(long)local_24);
      (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[4])(this,ppVar3);
    }
  }
  ::wasm::handle_unreachable
            ("rethrow",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
             ,0x1149);
}

Assistant:

Flow visitRethrow(Rethrow* curr) {
    for (int i = exceptionStack.size() - 1; i >= 0; i--) {
      if (exceptionStack[i].second == curr->target) {
        throwException(exceptionStack[i].first);
      }
    }
    WASM_UNREACHABLE("rethrow");
  }